

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

uint32_t Catch::anon_unknown_1::headerValue(uchar c)

{
  ReusableStringStream *pRVar1;
  SourceLineInfo local_58;
  ReusableStringStream local_48;
  string local_30;
  uchar local_d;
  uint local_c;
  uchar c_local;
  
  if ((c & 0xe0) == 0xc0) {
    local_c = c & 0x1f;
  }
  else if ((c & 0xf0) == 0xe0) {
    local_c = c & 0xf;
  }
  else {
    if ((c & 0xf8) != 0xf0) {
      local_d = c;
      ReusableStringStream::ReusableStringStream(&local_48);
      SourceLineInfo::SourceLineInfo
                (&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp"
                 ,0x3c6d);
      pRVar1 = ReusableStringStream::operator<<(&local_48,&local_58);
      pRVar1 = ReusableStringStream::operator<<(pRVar1,(char (*) [26])": Internal Catch2 error: ");
      pRVar1 = ReusableStringStream::operator<<
                         (pRVar1,(char (*) [47])"Invalid multibyte utf-8 start byte encountered");
      ReusableStringStream::str_abi_cxx11_(&local_30,pRVar1);
      throw_logic_error(&local_30);
    }
    local_c = c & 7;
  }
  return local_c;
}

Assistant:

uint32_t headerValue(unsigned char c) {
        if ((c & 0xE0) == 0xC0) {
            return c & 0x1F;
        }
        if ((c & 0xF0) == 0xE0) {
            return c & 0x0F;
        }
        if ((c & 0xF8) == 0xF0) {
            return c & 0x07;
        }
        CATCH_INTERNAL_ERROR("Invalid multibyte utf-8 start byte encountered");
    }